

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-loader.c
# Opt level: O0

void parse_bapcod_solver_json_dump(PerfProfRun *run,cJSON *root)

{
  _Bool _Var1;
  cJSON_bool cVar2;
  cJSON *pcVar3;
  cJSON *item;
  cJSON *item_00;
  cJSON *local_78;
  cJSON *local_70;
  cJSON *itm_cost;
  cJSON *pcStack_58;
  int32_t num_elems;
  cJSON *elem;
  cJSON *pricer_success;
  cJSON *itm_took;
  cJSON *columns_reduced_cost;
  double time;
  double primal_bound;
  SolveStatus status;
  cJSON *rcsp_infos;
  cJSON *root_local;
  PerfProfRun *run_local;
  
  pcVar3 = cJSON_GetObjectItemCaseSensitive(root,"rcsp-infos");
  primal_bound._4_4_ = SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL|SOLVE_STATUS_CLOSED_PROBLEM;
  time = 2.0;
  columns_reduced_cost = (cJSON *)0x7ff0000000000000;
  if ((pcVar3 != (cJSON *)0x0) && (cVar2 = cJSON_IsObject(pcVar3), cVar2 != 0)) {
    item = cJSON_GetObjectItemCaseSensitive(pcVar3,"columnsReducedCost");
    item_00 = cJSON_GetObjectItemCaseSensitive(pcVar3,"seconds");
    pcVar3 = cJSON_GetObjectItemCaseSensitive(pcVar3,"pricerSuccess");
    if ((item_00 != (cJSON *)0x0) && (cVar2 = cJSON_IsNumber(item_00), cVar2 != 0)) {
      columns_reduced_cost = (cJSON *)cJSON_GetNumberValue(item_00);
    }
    if ((item != (cJSON *)0x0) && (cVar2 = cJSON_IsArray(item), cVar2 != 0)) {
      itm_cost._4_4_ = 0;
      if (item == (cJSON *)0x0) {
        local_70 = (cJSON *)0x0;
      }
      else {
        local_70 = item->child;
      }
      for (pcStack_58 = local_70; pcStack_58 != (cJSON *)0x0; pcStack_58 = pcStack_58->next) {
        itm_cost._4_4_ = itm_cost._4_4_ + 1;
      }
      if (itm_cost._4_4_ == 1) {
        if (item == (cJSON *)0x0) {
          local_78 = (cJSON *)0x0;
        }
        else {
          local_78 = item->child;
        }
        if (((local_78 != (cJSON *)0x0) && (local_78 != (cJSON *)0x0)) &&
           (cVar2 = cJSON_IsNumber(local_78), cVar2 != 0)) {
          time = cJSON_GetNumberValue(local_78);
        }
      }
      else {
        primal_bound._4_4_ = SOLVE_STATUS_ERR;
      }
    }
    if ((pcVar3 == (cJSON *)0x0) || (cVar2 = cJSON_IsFalse(pcVar3), cVar2 == 0)) {
      _Var1 = is_valid_reduced_cost(time);
      if (!_Var1) {
        primal_bound._4_4_ = SOLVE_STATUS_CLOSED_PROBLEM;
        time = 1.0;
      }
    }
    else {
      time = 2.0;
      primal_bound._4_4_ = SOLVE_STATUS_ERR;
    }
  }
  (run->solution).status = primal_bound._4_4_;
  (run->solution).stats[0] = (double)columns_reduced_cost;
  (run->solution).stats[1] = time;
  (run->solution).stats[2] = time;
  return;
}

Assistant:

void parse_bapcod_solver_json_dump(PerfProfRun *run, cJSON *root) {
    cJSON *rcsp_infos = cJSON_GetObjectItemCaseSensitive(root, "rcsp-infos");

    SolveStatus status =
        SOLVE_STATUS_CLOSED_PROBLEM | SOLVE_STATUS_PRIMAL_SOLUTION_AVAIL;
    double primal_bound = CRASHED_SOLVER_DEFAULT_COST_VAL;
    double time = INFINITY;

    if (rcsp_infos && cJSON_IsObject(rcsp_infos)) {
        cJSON *columns_reduced_cost =
            cJSON_GetObjectItemCaseSensitive(rcsp_infos, "columnsReducedCost");
        cJSON *itm_took =
            cJSON_GetObjectItemCaseSensitive(rcsp_infos, "seconds");
        cJSON *pricer_success =
            cJSON_GetObjectItemCaseSensitive(rcsp_infos, "pricerSuccess");

        if (itm_took && cJSON_IsNumber(itm_took)) {
            time = cJSON_GetNumberValue(itm_took);
        }

        if (columns_reduced_cost && cJSON_IsArray(columns_reduced_cost)) {
            cJSON *elem = NULL;
            int32_t num_elems = 0;
            cJSON_ArrayForEach(elem, columns_reduced_cost) { num_elems += 1; }

            if (num_elems == 1) {
                cJSON_ArrayForEach(elem, columns_reduced_cost) {
                    cJSON *itm_cost = elem;
                    if (itm_cost && cJSON_IsNumber(itm_cost)) {
                        primal_bound = cJSON_GetNumberValue(itm_cost);
                    }
                    break;
                }
            } else {
                status = SOLVE_STATUS_ERR;
            }
        }

        //
        // Replace the cost if it is non valid negative reduced cost,
        // or if the solver crashed in the process.
        //
        if (pricer_success && cJSON_IsFalse(pricer_success)) {
            primal_bound = CRASHED_SOLVER_DEFAULT_COST_VAL;
            status = SOLVE_STATUS_ERR;
        } else if (!is_valid_reduced_cost(primal_bound)) {
            status = SOLVE_STATUS_CLOSED_PROBLEM;
            primal_bound = INFEASIBLE_SOLUTION_DEFAULT_COST_VAL;
        }
    }

    run->solution.status = status;
    run->solution.stats[PERFPROF_STAT_KIND_TIME] = time;
    run->solution.stats[PERFPROF_STAT_KIND_PRIMAL_BOUND] = primal_bound;
    run->solution.stats[PERFPROF_STAT_KIND_DUAL_BOUND] = primal_bound;
}